

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O3

void __thiscall CHog::calcDiff(CHog *this,uchar *image,double **magnitudeTable)

{
  long lVar1;
  uint uVar2;
  double dVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int **ppiVar7;
  int **ppiVar8;
  int *piVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long local_60;
  
  iVar13 = this->imgHeight;
  if (0 < iVar13) {
    ppiVar7 = this->dx;
    ppiVar8 = this->dy;
    uVar16 = (ulong)(uint)this->imgWidth;
    local_60 = 0;
    iVar18 = 0;
    do {
      if (0 < (int)uVar16) {
        piVar9 = ppiVar7[local_60];
        iVar12 = (int)local_60;
        piVar10 = ppiVar8[local_60];
        iVar13 = this->imgChannel;
        lVar15 = 0;
        do {
          iVar6 = (int)uVar16;
          iVar11 = (int)lVar15;
          iVar17 = this->widthStep * iVar12 + iVar18;
          lVar1 = lVar15 + 1;
          piVar9[lVar15] =
               (uint)image[((iVar6 + iVar11 + -1) % iVar6) * iVar13 + iVar17] -
               (uint)image[(((int)lVar1 + iVar6) % iVar6) * iVar13 + iVar17];
          iVar13 = this->imgHeight;
          iVar18 = this->imgChannel * iVar11 + iVar18;
          bVar4 = image[((iVar13 + iVar12 + -1) % iVar13) * this->widthStep + iVar18];
          bVar5 = image[((iVar13 + iVar12 + 1) % iVar13) * this->widthStep + iVar18];
          piVar10[lVar15] = (int)((ulong)bVar4 - (ulong)bVar5);
          iVar13 = this->imgChannel;
          iVar18 = 1;
          if (1 < iVar13) {
            dVar3 = magnitudeTable[((ulong)bVar4 - (ulong)bVar5) + 0xff]
                    [(long)piVar9[lVar15] + 0xff];
            do {
              iVar6 = this->imgHeight;
              iVar17 = this->widthStep;
              iVar14 = iVar11 * iVar13 + iVar18;
              bVar4 = image[((iVar6 + iVar12 + -1) % iVar6) * iVar17 + iVar14];
              bVar5 = image[((iVar6 + iVar12 + 1) % iVar6) * iVar17 + iVar14];
              uVar2 = ((uint)bVar4 - (uint)bVar5) + 0xff;
              if ((double)(int)dVar3 < magnitudeTable[uVar2][uVar2]) {
                iVar6 = this->imgWidth;
                iVar17 = iVar17 * iVar12 + iVar18;
                piVar9[lVar15] =
                     (uint)image[((iVar6 + iVar11 + -1) % iVar6) * iVar13 + iVar17] -
                     (uint)image[(((int)lVar1 + iVar6) % iVar6) * iVar13 + iVar17];
                piVar10[lVar15] = (uint)bVar4 - (uint)bVar5;
                iVar13 = this->imgChannel;
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 < iVar13);
          }
          uVar16 = (ulong)this->imgWidth;
          lVar15 = lVar1;
        } while (lVar1 < (long)uVar16);
        iVar13 = this->imgHeight;
      }
      local_60 = local_60 + 1;
    } while (local_60 < iVar13);
  }
  return;
}

Assistant:

void CHog::calcDiff(unsigned char* image, double** magnitudeTable) //图像数据
{
    int x=0, y=0, c=0;
    int xDiffs, yDiffs, magni;
    //cout<<"calculating differential"<<endl;
    //遍历图像//
    for(y=0; y<imgHeight; y++)
    {
        for(x=0; x<imgWidth; x++)
        {
            dx[y][x] = (int)image[y*widthStep+((x-1+imgWidth)%imgWidth)*imgChannel+c] - (int)image[y*widthStep+((x+1+imgWidth)%imgWidth)*imgChannel+c]; //x方向梯度
            dy[y][x] = (int)image[(y-1+imgHeight)%imgHeight*widthStep+x*imgChannel+c] - (int)image[(y+1+imgHeight)%imgHeight*widthStep+x*imgChannel+c]; //y方向梯度
            magni = magnitudeTable[dy[y][x]+255][dx[y][x]+255];
            for(c=1; c<imgChannel; c++)
            {
                xDiffs = (int)image[y*widthStep+((x-1+imgWidth)%imgWidth)*imgChannel+c] - (int)image[y*widthStep+((x+1+imgWidth)%imgWidth)*imgChannel+c]; //x方向梯度
                yDiffs = (int)image[(y-1+imgHeight)%imgHeight*widthStep+x*imgChannel+c] - (int)image[(y+1+imgHeight)%imgHeight*widthStep+x*imgChannel+c]; //y方向梯度
                if(magni < magnitudeTable[yDiffs+255][yDiffs+255])
                {
                    dx[y][x] = xDiffs;
                    dy[y][x] = yDiffs;
                }
            }

        }
    }
    //cout<<"differential calculated\t"<<endl;
}